

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O3

duckdb_value
duckdb_create_array_value(duckdb_logical_type type,duckdb_value *values,idx_t value_count)

{
  bool bVar1;
  Value *this;
  idx_t iVar2;
  vector<duckdb::Value,_true> unwrapped_values;
  pointer local_b8;
  pointer pVStack_b0;
  pointer local_a8;
  LogicalType local_a0;
  vector<duckdb::Value,_true> local_88;
  undefined1 *local_70 [8];
  
  local_70[0] = (undefined1 *)&local_b8;
  if (value_count < 100000 && (values != (duckdb_value *)0x0 && type != (duckdb_logical_type)0x0)) {
    local_b8 = (pointer)((ulong)local_b8 & 0xffffffffffffff00);
    bVar1 = duckdb::TypeVisitor::
            Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                      ((LogicalType *)type,(anon_class_8_1_50811320 *)local_70);
    if (!bVar1) {
      local_b8 = (pointer)CONCAT71(local_b8._1_7_,3);
      local_70[0] = (undefined1 *)&local_b8;
      bVar1 = duckdb::TypeVisitor::
              Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                        ((LogicalType *)type,(anon_class_8_1_50811320 *)local_70);
      if (!bVar1) {
        local_b8 = (pointer)0x0;
        pVStack_b0 = (pointer)0x0;
        local_a8 = (pointer)0x0;
        if (value_count != 0) {
          this = (Value *)0x0;
          iVar2 = 0;
          do {
            if ((value_type *)values[iVar2] == (value_type *)0x0) goto LAB_015dff89;
            std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8,
                       (value_type *)values[iVar2]);
            iVar2 = iVar2 + 1;
          } while (value_count != iVar2);
        }
        this = (Value *)operator_new(0x40);
        duckdb::LogicalType::LogicalType(&local_a0,SQLNULL);
        duckdb::Value::Value(this,&local_a0);
        duckdb::LogicalType::~LogicalType(&local_a0);
        local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = local_b8;
        local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = pVStack_b0;
        local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_a8;
        local_b8 = (pointer)0x0;
        pVStack_b0 = (pointer)0x0;
        local_a8 = (pointer)0x0;
        duckdb::Value::ARRAY((Value *)local_70,(LogicalType *)type,&local_88);
        duckdb::Value::operator=(this,(Value *)local_70);
        duckdb::Value::~Value((Value *)local_70);
        std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
LAB_015dff89:
        std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
        return (duckdb_value)this;
      }
    }
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_create_array_value(duckdb_logical_type type, duckdb_value *values, idx_t value_count) {
	if (!type || !values) {
		return nullptr;
	}
	if (value_count >= duckdb::ArrayType::MAX_ARRAY_SIZE) {
		return nullptr;
	}
	auto &logical_type = UnwrapType(type);
	if (duckdb::TypeVisitor::Contains(logical_type, duckdb::LogicalTypeId::INVALID) ||
	    duckdb::TypeVisitor::Contains(logical_type, duckdb::LogicalTypeId::ANY)) {
		return nullptr;
	}
	duckdb::vector<duckdb::Value> unwrapped_values;

	for (idx_t i = 0; i < value_count; i++) {
		auto value = values[i];
		if (!value) {
			return nullptr;
		}
		unwrapped_values.push_back(UnwrapValue(value));
	}
	duckdb::Value *array_value = new duckdb::Value;
	try {
		*array_value = duckdb::Value::ARRAY(logical_type, std::move(unwrapped_values));
	} catch (...) {
		delete array_value;
		return nullptr;
	}
	return WrapValue(array_value);
}